

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

string * __thiscall
flatbuffers::(anonymous_namespace)::TokenToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int t)

{
  string *psVar1;
  string *extraout_RAX;
  allocator<char> local_19;
  
  if ((int)this < 0x100) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    psVar1 = (string *)
             std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,0,0,'\x01');
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               _ZZN11flatbuffers12_GLOBAL__N_113TokenToStringB5cxx11EiE6tokens_rel +
               *(int *)(_ZZN11flatbuffers12_GLOBAL__N_113TokenToStringB5cxx11EiE6tokens_rel +
                       (ulong)((int)this - 0x100) * 4),&local_19);
    psVar1 = extraout_RAX;
  }
  return psVar1;
}

Assistant:

static std::string TokenToString(int t) {
  static const char * const tokens[] = {
    #define FLATBUFFERS_TOKEN(NAME, VALUE, STRING) STRING,
      FLATBUFFERS_GEN_TOKENS(FLATBUFFERS_TOKEN)
    #undef FLATBUFFERS_TOKEN
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, ...) \
      IDLTYPE,
      FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
  };
  if (t < 256) {  // A single ascii char token.
    std::string s;
    s.append(1, static_cast<char>(t));
    return s;
  } else {       // Other tokens.
    return tokens[t - 256];
  }
}